

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ladspa.c
# Opt level: O3

int mixed_make_segment_ladspa(char *file,uint32_t index,uint32_t samplerate,mixed_segment *segment)

{
  int iVar1;
  LADSPA_Descriptor **_descriptor;
  LADSPA_Descriptor *pLVar2;
  uint uVar3;
  unsigned_long uVar4;
  
  _descriptor = (LADSPA_Descriptor **)(*mixed_calloc)(1,0x20);
  if (_descriptor == (LADSPA_Descriptor **)0x0) {
    mixed_err(1);
  }
  else {
    iVar1 = ladspa_load_descriptor(file,index,_descriptor);
    if (iVar1 != 0) {
      pLVar2 = (LADSPA_Descriptor *)(*mixed_calloc)((*_descriptor)->PortCount,0x10);
      _descriptor[3] = pLVar2;
      if (pLVar2 == (LADSPA_Descriptor *)0x0) {
        iVar1 = 1;
      }
      else {
        pLVar2 = (LADSPA_Descriptor *)(*(*_descriptor)->instantiate)(*_descriptor,(ulong)samplerate)
        ;
        _descriptor[1] = pLVar2;
        if (pLVar2 != (LADSPA_Descriptor *)0x0) {
          pLVar2 = *_descriptor;
          if (pLVar2->PortCount != 0) {
            uVar3 = 1;
            uVar4 = 0;
            do {
              (*pLVar2->connect_port)
                        (_descriptor[1],uVar4,
                         (LADSPA_Data *)((long)&_descriptor[3]->Label + uVar4 * 0x10 + 4));
              uVar4 = (unsigned_long)uVar3;
              pLVar2 = *_descriptor;
              uVar3 = uVar3 + 1;
            } while (uVar4 < pLVar2->PortCount);
          }
          segment->free = ladspa_segment_free;
          segment->mix = ladspa_segment_mix;
          segment->start = ladspa_segment_start;
          segment->end = ladspa_segment_end;
          segment->set_in = ladspa_segment_set_in;
          segment->set_out = ladspa_segment_set_out;
          segment->info = ladspa_segment_info;
          segment->get = ladspa_segment_get;
          segment->set = ladspa_segment_set;
          segment->data = _descriptor;
          return 1;
        }
        iVar1 = 0xe;
      }
      mixed_err(iVar1);
    }
    if (_descriptor[3] != (LADSPA_Descriptor *)0x0) {
      (*mixed_free)(_descriptor[3]);
    }
    (*mixed_free)(_descriptor);
  }
  return 0;
}

Assistant:

MIXED_EXPORT int mixed_make_segment_ladspa(const char *file, uint32_t index, uint32_t samplerate, struct mixed_segment *segment){
  struct ladspa_segment_data *data = 0;

  data = mixed_calloc(1, sizeof(struct ladspa_segment_data));
  if(!data){
    mixed_err(MIXED_OUT_OF_MEMORY);
    goto cleanup;
  }

  if(!ladspa_load_descriptor(file, index, &data->descriptor)){
    goto cleanup;
  }

  data->ports = mixed_calloc(data->descriptor->PortCount, sizeof(struct ladspa_port));
  if(!data->ports){
    mixed_err(MIXED_OUT_OF_MEMORY);
    goto cleanup;
  }

  data->handle = data->descriptor->instantiate(data->descriptor, samplerate);  
  if(!data->handle){
    mixed_err(MIXED_LADSPA_INSTANTIATION_FAILED);
    goto cleanup;
  }

  // Connect all ports to shims
  for(uint32_t i=0; i<data->descriptor->PortCount; ++i){
    data->descriptor->connect_port(data->handle, i, &data->ports[i].control);
  }

  segment->free = ladspa_segment_free;
  segment->mix = ladspa_segment_mix;
  segment->start = ladspa_segment_start;
  segment->end = ladspa_segment_end;
  segment->set_in = ladspa_segment_set_in;
  segment->set_out = ladspa_segment_set_out;
  segment->info = ladspa_segment_info;
  segment->get = ladspa_segment_get;
  segment->set = ladspa_segment_set;
  segment->data = data;
  return 1;

 cleanup:
  if(data){
    if(data->ports)
      mixed_free(data->ports);
    mixed_free(data);
  }
  
  return 0;
}